

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Type>
reflection::CreateType
          (FlatBufferBuilder *_fbb,BaseType base_type,BaseType element,int32_t index,
          uint16_t fixed_length,uint32_t base_size,uint32_t element_size)

{
  Offset<reflection::Type> OVar1;
  TypeBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  TypeBuilder::add_element_size(&local_40,element_size);
  TypeBuilder::add_base_size(&local_40,base_size);
  TypeBuilder::add_index(&local_40,index);
  TypeBuilder::add_fixed_length(&local_40,fixed_length);
  TypeBuilder::add_element(&local_40,element);
  TypeBuilder::add_base_type(&local_40,base_type);
  OVar1 = TypeBuilder::Finish(&local_40);
  return (Offset<reflection::Type>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Type> CreateType(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    reflection::BaseType base_type = reflection::None,
    reflection::BaseType element = reflection::None,
    int32_t index = -1,
    uint16_t fixed_length = 0,
    uint32_t base_size = 4,
    uint32_t element_size = 0) {
  TypeBuilder builder_(_fbb);
  builder_.add_element_size(element_size);
  builder_.add_base_size(base_size);
  builder_.add_index(index);
  builder_.add_fixed_length(fixed_length);
  builder_.add_element(element);
  builder_.add_base_type(base_type);
  return builder_.Finish();
}